

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::GenerateMembers
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  Options *pOVar4;
  string_view local_1f8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1e0;
  string_view local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  Options local_1a8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_150;
  string_view local_148;
  string_view local_138;
  string_view local_128;
  Options local_118;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_c0;
  string_view local_b8;
  string_view local_a8;
  string_view local_98 [2];
  Options local_78;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutablePrimitiveFieldGenerator *this_local;
  
  vars = &(this->super_ImmutablePrimitiveFieldGenerator).variables_;
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "@SuppressWarnings(\"serial\")\nprivate $field_list_type$ $name$_ =\n    $empty_list$;\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,local_28);
  PrintExtraFieldInfo(vars,local_18);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_78,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_GETTER,&local_78,false,false,false);
  java::Options::~Options(&local_78);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_98,
             "@java.lang.Override\n$deprecation$public java.util.List<$boxed_type$>\n    ${$get$capitalized_name$List$}$() {\n  return $name$_;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_98[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(pPVar2,local_a8,local_b8,pFVar1,local_c0)
  ;
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_118,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_COUNT,&local_118,false,false,false);
  java::Options::~Options(&local_118);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,
             "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_128);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_150);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_138,local_148,pFVar1,local_150);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar4 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  java::Options::Options(&local_1a8,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_1a8,false,false,false);
  java::Options::~Options(&local_1a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b8,
             "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  return $repeated_get$(index);\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_1b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"}");
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1e0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1c8,local_1d8,pFVar1,local_1e0);
  bVar3 = FieldDescriptor::is_packed((this->super_ImmutablePrimitiveFieldGenerator).descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f8,"private int $name$MemoizedSerializedSize = -1;\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_1f8);
  }
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "@SuppressWarnings(\"serial\")\n"
                 "private $field_list_type$ $name$_ =\n"
                 "    $empty_list$;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<$boxed_type$>\n"
                 "    ${$get$capitalized_name$List$}$() {\n"
                 "  return $name$_;\n"  // note:  unmodifiable list
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $repeated_get$(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  if (descriptor_->is_packed()) {
    printer->Print(variables_,
                   "private int $name$MemoizedSerializedSize = -1;\n");
  }
}